

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void pnga_distribution(Integer g_a,Integer proc,Integer *lo,Integer *hi)

{
  global_array_t *pgVar1;
  short sVar2;
  int iVar3;
  C_Integer *pCVar4;
  global_array_t *pgVar5;
  Integer IVar6;
  C_Integer CVar7;
  long lVar8;
  int iVar9;
  C_Integer CVar10;
  long lVar11;
  long lVar12;
  int _ndim;
  uint uVar13;
  int _ndim_1;
  long lVar14;
  long lVar15;
  char err_string [256];
  int local_138 [66];
  
  lVar8 = g_a + 1000;
  if ((g_a < -1000) || (_max_global_array <= lVar8)) {
    sprintf((char *)local_138,"%s: INVALID ARRAY HANDLE","nga_distribution");
    pnga_error((char *)local_138,g_a);
  }
  if (GA[lVar8].actv == 0) {
    sprintf((char *)local_138,"%s: ARRAY NOT ACTIVE","nga_distribution");
    pnga_error((char *)local_138,g_a);
  }
  CVar10 = proc;
  if (0 < GA[lVar8].num_rstrctd) {
    CVar10 = GA[lVar8].rank_rstrctd[proc];
  }
  if (GA[lVar8].property == 1) {
    IVar6 = pnga_cluster_proc_nodeid(proc);
    IVar6 = pnga_cluster_nprocs(IVar6);
    CVar10 = proc % IVar6;
  }
  pgVar5 = GA;
  pgVar1 = GA + lVar8;
  iVar9 = GA[lVar8].distr_type;
  if (iVar9 - 1U < 3) {
    sVar2 = pgVar1->ndim;
    uVar13 = (uint)sVar2;
    lVar8 = pgVar1->num_blocks[0];
    lVar11 = (long)(int)CVar10 % lVar8;
    local_138[0] = (int)lVar11;
    if (1 < (int)uVar13) {
      lVar14 = 0;
      do {
        CVar10 = (long)((int)CVar10 - (int)lVar11) / lVar8;
        lVar8 = GA[g_a + 1000].num_blocks[lVar14 + 1];
        lVar11 = (long)(int)CVar10 % lVar8;
        local_138[lVar14 + 1] = (int)lVar11;
        lVar14 = lVar14 + 1;
      } while ((ulong)uVar13 - 1 != lVar14);
    }
    if (0 < sVar2) {
      lVar8 = 0;
      do {
        pgVar1 = GA;
        iVar9 = *(int *)((long)local_138 + lVar8);
        *(long *)((long)lo + lVar8 * 2) =
             *(long *)((long)GA[g_a + 1000].block_dims + lVar8 * 2) * (long)iVar9 + 1;
        lVar14 = ((long)iVar9 + 1) * *(long *)((long)pgVar1[g_a + 1000].block_dims + lVar8 * 2);
        *(long *)((long)hi + lVar8 * 2) = lVar14;
        lVar11 = *(long *)((long)pgVar1[g_a + 1000].dims + lVar8 * 2);
        if (lVar11 <= lVar14) {
          lVar14 = lVar11;
        }
        *(long *)((long)hi + lVar8 * 2) = lVar14;
        lVar8 = lVar8 + 4;
      } while ((ulong)uVar13 << 2 != lVar8);
    }
  }
  else if (iVar9 == 4) {
    sVar2 = pgVar1->ndim;
    uVar13 = (uint)sVar2;
    lVar11 = pgVar1->num_blocks[0];
    lVar14 = (long)(int)CVar10 % lVar11;
    local_138[0] = (int)lVar14;
    if (1 < (int)uVar13) {
      lVar12 = 0;
      do {
        CVar10 = (long)((int)CVar10 - (int)lVar14) / lVar11;
        lVar11 = GA[g_a + 1000].num_blocks[lVar12 + 1];
        lVar14 = (long)(int)CVar10 % lVar11;
        local_138[lVar12 + 1] = (int)lVar14;
        lVar12 = lVar12 + 1;
      } while ((ulong)uVar13 - 1 != lVar12);
    }
    if (0 < sVar2) {
      pCVar4 = GA[lVar8].mapc;
      lVar8 = 0;
      iVar9 = 0;
      do {
        iVar3 = *(int *)((long)local_138 + lVar8);
        lVar11 = (long)iVar9 + (long)iVar3;
        *(C_Integer *)((long)lo + lVar8 * 2) = pCVar4[lVar11];
        if ((long)iVar3 < *(long *)((long)pgVar1->num_blocks + lVar8 * 2) + -1) {
          lVar11 = pCVar4[lVar11 + 1] + -1;
        }
        else {
          lVar11 = *(long *)((long)pgVar1->dims + lVar8 * 2);
        }
        *(long *)((long)hi + lVar8 * 2) = lVar11;
        iVar9 = iVar9 + *(int *)((long)pgVar1->num_blocks + lVar8 * 2);
        lVar8 = lVar8 + 4;
      } while ((ulong)uVar13 << 2 != lVar8);
    }
  }
  else if (iVar9 == 0) {
    if (pgVar1->num_rstrctd == 0) {
      sVar2 = pgVar1->ndim;
      lVar8 = (long)sVar2;
      if (0 < lVar8) {
        lVar11 = 1;
        lVar14 = 0;
        do {
          lVar11 = lVar11 * GA[g_a + 1000].nblock[lVar14];
          lVar14 = lVar14 + 1;
        } while (lVar8 != lVar14);
        if ((CVar10 < 0) || (lVar11 <= CVar10)) {
          if (0 < sVar2) {
            lVar11 = 0;
            do {
              lo[lVar11] = 0;
              hi[lVar11] = -1;
              lVar11 = lVar11 + 1;
            } while (lVar8 != lVar11);
          }
        }
        else if (0 < sVar2) {
          pCVar4 = pgVar1->mapc;
          lVar11 = 0;
          lVar14 = 0;
          do {
            lVar15 = (long)pgVar5[g_a + 1000].nblock[lVar11];
            lVar12 = CVar10 % lVar15;
            lo[lVar11] = pCVar4[lVar12 + lVar14];
            if (lVar12 == lVar15 + -1) {
              CVar7 = pgVar5[g_a + 1000].dims[lVar11];
            }
            else {
              CVar7 = pCVar4[lVar12 + lVar14 + 1] + -1;
            }
            lVar14 = lVar14 + lVar15;
            hi[lVar11] = CVar7;
            lVar11 = lVar11 + 1;
            CVar10 = CVar10 / lVar15;
          } while (lVar8 != lVar11);
        }
      }
    }
    else {
      sVar2 = pgVar1->ndim;
      lVar8 = (long)sVar2;
      if (CVar10 < pgVar1->num_rstrctd) {
        if (0 < sVar2) {
          lVar11 = 1;
          lVar14 = 0;
          do {
            lVar11 = lVar11 * GA[g_a + 1000].nblock[lVar14];
            lVar14 = lVar14 + 1;
          } while (lVar8 != lVar14);
          if ((CVar10 < 0) || (lVar11 <= CVar10)) {
            if (0 < sVar2) {
              lVar11 = 0;
              do {
                lo[lVar11] = 0;
                hi[lVar11] = -1;
                lVar11 = lVar11 + 1;
              } while (lVar8 != lVar11);
            }
          }
          else if (0 < sVar2) {
            pCVar4 = pgVar1->mapc;
            lVar11 = 0;
            lVar14 = 0;
            do {
              lVar15 = (long)pgVar5[g_a + 1000].nblock[lVar14];
              lVar12 = CVar10 % lVar15;
              lo[lVar14] = pCVar4[lVar12 + lVar11];
              if (lVar12 == lVar15 + -1) {
                CVar7 = pgVar5[g_a + 1000].dims[lVar14];
              }
              else {
                CVar7 = pCVar4[lVar12 + lVar11 + 1] + -1;
              }
              lVar11 = lVar11 + lVar15;
              hi[lVar14] = CVar7;
              lVar14 = lVar14 + 1;
              CVar10 = CVar10 / lVar15;
            } while (lVar8 != lVar14);
          }
        }
      }
      else if (0 < sVar2) {
        lVar11 = 0;
        do {
          lo[lVar11] = 0;
          hi[lVar11] = -1;
          lVar11 = lVar11 + 1;
        } while (lVar8 != lVar11);
      }
    }
  }
  return;
}

Assistant:

void pnga_distribution(Integer g_a, Integer proc, Integer *lo, Integer * hi)
{
  Integer ga_handle, lproc, old_grp;

  ga_check_handleM(g_a, "nga_distribution");
  ga_handle = (GA_OFFSET + g_a);

  lproc = proc;
  if (GA[ga_handle].num_rstrctd > 0) {
    lproc = GA[ga_handle].rank_rstrctd[lproc];
  }
  /* This currently assumes that read-only property can only be applied to
   * processors on the world group */
  if (GA[ga_handle].property == READ_ONLY) {
    Integer node = pnga_cluster_proc_nodeid(proc);
    Integer nodesize = pnga_cluster_nprocs(node);
    lproc = proc%nodesize;
  }
  ga_ownsM(ga_handle, lproc, lo, hi);
}